

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::ipc::HostImpl::OnInvokeMethod(HostImpl *this,ClientConnection *client,Frame *req_frame)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  uint uVar3;
  pid_t pVar4;
  _Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false> _Var5;
  uint64_t uVar6;
  long lVar7;
  element_type *ppHVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  code *pcVar9;
  long *plVar10;
  long lVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar14;
  unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
  decoded_req_args;
  Deferred<protozero::CppMessageObj> deferred_reply;
  long *local_140;
  ClientID local_138;
  long local_130;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  _Any_data local_108;
  code *local_f8;
  undefined8 uStack_f0;
  DeferredBase local_e8;
  DeferredBase local_c8;
  IPCFrame local_a8;
  
  _Var5._M_head_impl =
       (req_frame->msg_invoke_method_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
       .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethod_*,_false>._M_head_impl;
  protos::gen::IPCFrame::IPCFrame(&local_a8);
  uVar6 = req_frame->request_id_;
  local_a8._has_field_.super__Base_bitset<1UL>._M_w._0_1_ =
       (byte)local_a8._has_field_.super__Base_bitset<1UL>._M_w | 0x44;
  *(undefined1 *)
   ((long)local_a8.msg_invoke_method_reply_.ptr_._M_t.
          super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethodReply,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethodReply>_>
          ._M_t.
          super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethodReply>_>
          .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_false>.
          _M_head_impl + 8) = 0;
  *(byte *)((long)local_a8.msg_invoke_method_reply_.ptr_._M_t.
                  super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethodReply,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethodReply>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethodReply>_>
                  .super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_false>
                  ._M_head_impl + 0x50) =
       *(byte *)((long)local_a8.msg_invoke_method_reply_.ptr_._M_t.
                       super___uniq_ptr_impl<perfetto::protos::gen::IPCFrame_InvokeMethodReply,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethodReply>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethodReply>_>
                       .
                       super__Head_base<0UL,_perfetto::protos::gen::IPCFrame_InvokeMethodReply_*,_false>
                       ._M_head_impl + 0x50) | 2;
  _Var2 = (_Var5._M_head_impl)->service_id_;
  p_Var1 = &(this->services_)._M_t._M_impl.super__Rb_tree_header;
  p_Var13 = (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var12 = &p_Var1->_M_header;
  for (; p_Var13 != (_Base_ptr)0x0; p_Var13 = (&p_Var13->_M_left)[bVar14]) {
    bVar14 = p_Var13[1]._M_color < _Var2;
    if (!bVar14) {
      p_Var12 = p_Var13;
    }
  }
  p_Var13 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var12 != p_Var1) && (p_Var13 = p_Var12, _Var2 < p_Var12[1]._M_color)) {
    p_Var13 = &p_Var1->_M_header;
  }
  local_a8.request_id_ = uVar6;
  if ((_Rb_tree_header *)p_Var13 == p_Var1) {
    SendFrame(client,&local_a8,-1);
  }
  else {
    p_Var13 = p_Var13[2]._M_left;
    lVar11 = (**(code **)(*(long *)p_Var13 + 0x10))(p_Var13);
    uVar3 = (_Var5._M_head_impl)->method_id_;
    if (((ulong)uVar3 == 0) ||
       (lVar7 = *(long *)(lVar11 + 8), (ulong)(*(long *)(lVar11 + 0x10) - lVar7 >> 5) < (ulong)uVar3
       )) {
      SendFrame(client,&local_a8,-1);
    }
    else {
      lVar11 = (ulong)(uVar3 - 1) * 0x20;
      local_130 = lVar7;
      (**(code **)(lVar7 + 8 + lVar11))(&local_140,&(_Var5._M_head_impl)->args_proto_);
      if (local_140 == (long *)0x0) {
        SendFrame(client,&local_a8,-1);
      }
      else {
        local_108._M_unused._M_object = (void *)0x0;
        local_108._8_8_ = 0;
        local_f8 = (code *)0x0;
        uStack_f0 = 0;
        Deferred<protozero::CppMessageObj>::Deferred
                  ((Deferred<protozero::CppMessageObj> *)&local_e8,
                   (function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)
                   &local_108);
        if (local_f8 != (code *)0x0) {
          (*local_f8)((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
        }
        ppHVar8 = (this->weak_ptr_factory_).weak_ptr_.handle_.
                  super___shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
                  super___shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if ((_Var5._M_head_impl)->drop_reply_ == false) {
          local_138 = client->id;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          local_118 = (code *)0x0;
          pcStack_110 = (code *)0x0;
          local_128._M_unused._M_object = (void *)0x0;
          local_128._8_8_ = 0;
          local_128._M_unused._M_object = operator_new(0x20);
          *(element_type **)local_128._M_unused._0_8_ = ppHVar8;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_128._M_unused._0_8_ + 8) =
               this_00;
          *(ClientID *)((long)local_128._M_unused._0_8_ + 0x10) = local_138;
          *(uint64_t *)((long)local_128._M_unused._0_8_ + 0x18) = uVar6;
          pcStack_110 = std::
                        _Function_handler<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:70303:25)>
                        ::_M_invoke;
          local_118 = std::
                      _Function_handler<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:70303:25)>
                      ::_M_manager;
          Deferred<protozero::CppMessageObj>::Bind
                    ((Deferred<protozero::CppMessageObj> *)&local_e8,
                     (function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)
                     &local_128);
          if (local_118 != (code *)0x0) {
            (*local_118)((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
          }
        }
        uVar3 = ((client->sock)._M_t.
                 super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                 .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl)->
                peer_uid_;
        _DAT_003d6b58 = (ulong)uVar3;
        DAT_003d6b49 = 1;
        if (((anonymous_namespace)::g_crash_key_uid & 1) == 0) {
          base::CrashKey::Register((CrashKey *)&(anonymous_namespace)::g_crash_key_uid);
        }
        plVar10 = local_140;
        pVar4 = ((client->sock)._M_t.
                 super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                 .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl)->
                peer_pid_;
        p_Var13->_M_parent = (_Base_ptr)client->id;
        *(uint *)&p_Var13->_M_left = uVar3;
        *(pid_t *)((long)&p_Var13->_M_left + 4) = pVar4;
        p_Var13->_M_right = (_Base_ptr)&client->received_fd;
        pcVar9 = *(code **)(local_130 + lVar11 + 0x18);
        DeferredBase::DeferredBase(&local_c8,&local_e8);
        (*pcVar9)(p_Var13,plVar10,&local_c8);
        DeferredBase::~DeferredBase(&local_c8);
        p_Var13->_M_right = (_Base_ptr)0x0;
        p_Var13->_M_parent = (_Base_ptr)0x0;
        p_Var13->_M_left = (_Base_ptr)0xffffffffffffffff;
        _DAT_003d6b58 = 0;
        DAT_003d6b49 = 0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        DeferredBase::~DeferredBase(&local_e8);
      }
      if (local_140 != (long *)0x0) {
        (**(code **)(*local_140 + 8))();
      }
    }
  }
  protos::gen::IPCFrame::~IPCFrame(&local_a8);
  return;
}

Assistant:

void HostImpl::OnInvokeMethod(ClientConnection* client,
                              const Frame& req_frame) {
  const Frame::InvokeMethod& req = req_frame.msg_invoke_method();
  Frame reply_frame;
  RequestID request_id = req_frame.request_id();
  reply_frame.set_request_id(request_id);
  reply_frame.mutable_msg_invoke_method_reply()->set_success(false);
  auto svc_it = services_.find(req.service_id());
  if (svc_it == services_.end())
    return SendFrame(client, reply_frame);  // |success| == false by default.

  Service* service = svc_it->second.instance.get();
  const ServiceDescriptor& svc = service->GetDescriptor();
  const auto& methods = svc.methods;
  const uint32_t method_id = req.method_id();
  if (method_id == 0 || method_id > methods.size())
    return SendFrame(client, reply_frame);

  const ServiceDescriptor::Method& method = methods[method_id - 1];
  std::unique_ptr<ProtoMessage> decoded_req_args(
      method.request_proto_decoder(req.args_proto()));
  if (!decoded_req_args)
    return SendFrame(client, reply_frame);

  Deferred<ProtoMessage> deferred_reply;
  base::WeakPtr<HostImpl> host_weak_ptr = weak_ptr_factory_.GetWeakPtr();
  ClientID client_id = client->id;

  if (!req.drop_reply()) {
    deferred_reply.Bind([host_weak_ptr, client_id,
                         request_id](AsyncResult<ProtoMessage> reply) {
      if (!host_weak_ptr)
        return;  // The reply came too late, the HostImpl has gone.
      host_weak_ptr->ReplyToMethodInvocation(client_id, request_id,
                                             std::move(reply));
    });
  }

  auto peer_uid = GetPosixPeerUid(client->sock.get());
  auto scoped_key = g_crash_key_uid.SetScoped(static_cast<int64_t>(peer_uid));
  service->client_info_ =
      ClientInfo(client->id, peer_uid, GetLinuxPeerPid(client->sock.get()));
  service->received_fd_ = &client->received_fd;
  method.invoker(service, *decoded_req_args, std::move(deferred_reply));
  service->received_fd_ = nullptr;
  service->client_info_ = ClientInfo();
}